

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOOLElimination.cpp
# Opt level: O3

void __thiscall
FOOLElimination::collectSorts
          (FOOLElimination *this,VList *vars,TermStack *typeVars,TermStack *termVars,
          TermStack *allVars,TermStack *termVarSorts)

{
  uint uVar1;
  uint64_t uVar2;
  bool bVar3;
  TermList TVar4;
  Entry *pEVar5;
  TermList TVar6;
  TermList *pTVar7;
  TermList **ppTVar8;
  TermList *pTVar9;
  ulong uVar10;
  ulong uVar11;
  uint local_4c;
  FOOLElimination *local_48;
  TermList **local_40;
  TermList **local_38;
  
  local_48 = this;
  if (vars != (VList *)0x0) {
    local_48 = (FOOLElimination *)&this->_varSorts;
    local_38 = &termVars->_cursor;
    local_40 = &typeVars->_cursor;
    do {
      uVar1 = vars->_head;
      vars = vars->_tail;
      TVar4 = Kernel::AtomicSort::defaultSort();
      local_4c = uVar1;
      pEVar5 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
               findEntry((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
                          *)local_48,&local_4c);
      if (pEVar5 != (Entry *)0x0) {
        TVar4._content = (pEVar5->_val)._content;
      }
      TVar6 = Kernel::AtomicSort::superSort();
      if (TVar4._content == TVar6._content) {
        pTVar7 = allVars->_cursor;
        if (pTVar7 == allVars->_end) {
          Lib::Stack<Kernel::TermList>::expand(allVars);
          pTVar7 = allVars->_cursor;
        }
        uVar10 = (ulong)(uVar1 * 4 + 1);
        pTVar7->_content = uVar10;
        allVars->_cursor = pTVar7 + 1;
        pTVar7 = typeVars->_cursor;
        if (pTVar7 == typeVars->_end) {
          Lib::Stack<Kernel::TermList>::expand(typeVars);
          pTVar7 = typeVars->_cursor;
        }
        pTVar7->_content = uVar10;
        ppTVar8 = local_40;
      }
      else {
        pTVar7 = termVarSorts->_cursor;
        if (pTVar7 == termVarSorts->_end) {
          Lib::Stack<Kernel::TermList>::expand(termVarSorts);
          pTVar7 = termVarSorts->_cursor;
        }
        pTVar7->_content = TVar4._content;
        termVarSorts->_cursor = pTVar7 + 1;
        pTVar7 = termVars->_cursor;
        if (pTVar7 == termVars->_end) {
          Lib::Stack<Kernel::TermList>::expand(termVars);
          pTVar7 = termVars->_cursor;
        }
        pTVar7->_content = (ulong)(uVar1 * 4 + 1);
        ppTVar8 = local_38;
      }
      *ppTVar8 = pTVar7 + 1;
    } while (vars != (List<unsigned_int> *)0x0);
  }
  pTVar7 = termVars->_stack;
  if (termVars->_cursor != pTVar7) {
    pTVar9 = allVars->_cursor;
    uVar10 = 0;
    uVar11 = 1;
    do {
      uVar2 = pTVar7[uVar10]._content;
      if (pTVar9 == allVars->_end) {
        Lib::Stack<Kernel::TermList>::expand(allVars);
        pTVar9 = allVars->_cursor;
        pTVar7 = termVars->_stack;
      }
      pTVar9->_content = uVar2;
      pTVar9 = pTVar9 + 1;
      allVars->_cursor = pTVar9;
      bVar3 = uVar11 < (ulong)((long)termVars->_cursor - (long)pTVar7 >> 3);
      uVar10 = uVar11;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (bVar3);
  }
  Kernel::SortHelper::normaliseArgSorts(typeVars,termVarSorts);
  return;
}

Assistant:

void FOOLElimination::collectSorts(VList* vars, TermStack& typeVars,
                                   TermStack& termVars, TermStack& allVars, TermStack& termVarSorts)
{
  VList::Iterator fvi(vars);
  while (fvi.hasNext()) {
    unsigned var = fvi.next();
    ASS_REP(_varSorts.find(var), var);
    TermList sort = _varSorts.get(var, AtomicSort::defaultSort());
    if(sort == AtomicSort::superSort()){
      //variable is a type var
      allVars.push(TermList(var, false));
      typeVars.push(TermList(var, false));
    } else {
      termVarSorts.push(sort);
      termVars.push(TermList(var, false));
    }   
  }
  
  for(unsigned i = 0; i < termVars.size(); i++){
    allVars.push(termVars[i]);
  }

  SortHelper::normaliseArgSorts(typeVars, termVarSorts);
}